

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mc64ad.c
# Opt level: O1

int_t mc64qd_(int_t *ip,int_t *lenl,int_t *lenh,int_t *w,int_t *wlen,double *a,int_t *nval,
             double *val)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  int iVar12;
  double adStack_90 [7];
  double split [10];
  
  *nval = 0;
  uVar3 = *wlen;
  if (0 < (int)uVar3) {
    lVar8 = 1;
    do {
      lVar11 = (long)w[lVar8 + -1];
      iVar4 = lenh[lVar11 + -1];
      if (lenl[lVar11 + -1] < iVar4) {
        iVar5 = ip[lVar11 + -1];
        uVar10 = *nval;
        lVar11 = (long)(lenl[lVar11 + -1] + iVar5);
        do {
          dVar1 = a[lVar11 + -1];
          if (uVar10 == 0) {
            adStack_90[1] = dVar1;
            uVar10 = 1;
          }
          else {
            uVar9 = (ulong)uVar10;
            iVar12 = uVar10 + 2;
            do {
              if ((int)uVar9 < 1) {
                iVar12 = 1;
                break;
              }
              dVar2 = adStack_90[uVar9];
              if ((dVar2 == dVar1) && (!NAN(dVar2) && !NAN(dVar1))) goto LAB_00114520;
              uVar9 = uVar9 - 1;
              iVar12 = iVar12 + -1;
            } while (dVar2 <= dVar1);
            uVar7 = uVar10;
            if (iVar12 <= (int)uVar10) {
              do {
                adStack_90[(ulong)uVar7 + 1] = adStack_90[(ulong)(uVar7 - 1) + 1];
                bVar6 = iVar12 < (int)uVar7;
                uVar7 = uVar7 - 1;
              } while (bVar6);
            }
            adStack_90[(ulong)(iVar12 - 1) + 1] = dVar1;
            uVar10 = uVar10 + 1;
          }
          *nval = uVar10;
          if (uVar10 == 10) goto LAB_00114538;
LAB_00114520:
          lVar11 = lVar11 + 1;
        } while (lVar11 < iVar4 + iVar5);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != (ulong)uVar3 + 1);
  }
LAB_00114538:
  if (0 < *nval) {
    *val = adStack_90[(ulong)((*nval + 1U >> 1) - 1) + 1];
  }
  return 0;
}

Assistant:

int_t mc64qd_(int_t *ip, int_t *lenl, int_t *lenh, 
	int_t *w, int_t *wlen, double *a, int_t *nval, double *
	val)
{
    /* System generated locals */
    int_t i__1, i__2, i__3;

    /* Local variables */
    int_t j, k, s;
    double ha;
    int_t ii, pos;
    double split[10];


/* *** Copyright (c) 1999  Council for the Central Laboratory of the */
/*     Research Councils                                             *** */
/* *** Although every effort has been made to ensure robustness and  *** */
/* *** reliability of the subroutines in this MC64 suite, we         *** */
/* *** disclaim any liability arising through the use or misuse of   *** */
/* *** any of the subroutines.                                       *** */
/* *** Any problems?   Contact ... */
/*     Iain Duff (I.Duff@rl.ac.uk) or Jacko Koster (jak@ii.uib.no)   *** */

/* This routine searches for at most XX different numerical values */
/* in the columns W(1:WLEN). XX>=2. */
/* Each column J is scanned between IP(J)+LENL(J) and IP(J)+LENH(J)-1 */
/* until XX values are found or all columns have been considered. */
/* On output, NVAL is the number of different values that is found */
/* and SPLIT(1:NVAL) contains the values in decreasing order. */
/* If NVAL > 0, the routine returns VAL = SPLIT((NVAL+1)/2). */

/* Scan columns in W(1:WLEN). For each encountered value, if value not */
/* already present in SPLIT(1:NVAL), insert value such that SPLIT */
/* remains sorted by decreasing value. */
/* The sorting is done by straightforward insertion; therefore the use */
/* of this routine should be avoided for large XX (XX < 20). */
    /* Parameter adjustments */
    --a;
    --w;
    --lenh;
    --lenl;
    --ip;

    /* Function Body */
    *nval = 0;
    i__1 = *wlen;
    for (k = 1; k <= i__1; ++k) {
	j = w[k];
	i__2 = ip[j] + lenh[j] - 1;
	for (ii = ip[j] + lenl[j]; ii <= i__2; ++ii) {
	    ha = a[ii];
	    if (*nval == 0) {
		split[0] = ha;
		*nval = 1;
	    } else {
/* Check presence of HA in SPLIT */
		for (s = *nval; s >= 1; --s) {
		    if (split[s - 1] == ha) {
			goto L15;
		    }
		    if (split[s - 1] > ha) {
			pos = s + 1;
			goto L21;
		    }
/* L20: */
		}
		pos = 1;
/* The insertion */
L21:
		i__3 = pos;
		for (s = *nval; s >= i__3; --s) {
		    split[s] = split[s - 1];
/* L22: */
		}
		split[pos - 1] = ha;
		++(*nval);
	    }
/* Exit loop if XX values are found */
	    if (*nval == 10) {
		goto L11;
	    }
L15:
	    ;
	}
/* L10: */
    }
/* Determine VAL */
L11:
    if (*nval > 0) {
	*val = split[(*nval + 1) / 2 - 1];
    }
    return 0;
}